

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

wasm_trap_t * callback(wasm_val_vec_t *args,wasm_val_vec_t *results)

{
  wasm_val_t *pwVar1;
  
  printf("Calling back...\n> ");
  pwVar1 = args->data;
  printf("> %u %lu %lu %u\n",(ulong)(uint)(pwVar1->of).i32,pwVar1[1].of.i64,pwVar1[2].of.i64,
         (ulong)(uint)pwVar1[3].of.i32);
  putchar(10);
  wasm_val_copy(results->data,args->data + 3);
  wasm_val_copy(results->data + 1,args->data + 1);
  wasm_val_copy(results->data + 2,args->data + 2);
  wasm_val_copy(results->data + 3,args->data);
  return (wasm_trap_t *)0x0;
}

Assistant:

own wasm_trap_t* callback(
  const wasm_val_vec_t* args, wasm_val_vec_t* results
) {
  printf("Calling back...\n> ");
  printf("> %"PRIu32" %"PRIu64" %"PRIu64" %"PRIu32"\n",
    args->data[0].of.i32, args->data[1].of.i64,
    args->data[2].of.i64, args->data[3].of.i32);
  printf("\n");

  wasm_val_copy(&results->data[0], &args->data[3]);
  wasm_val_copy(&results->data[1], &args->data[1]);
  wasm_val_copy(&results->data[2], &args->data[2]);
  wasm_val_copy(&results->data[3], &args->data[0]);
  return NULL;
}